

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O0

int duckdb_hll::hllMerge(uint8_t *max,robj *hll)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  long *in_RSI;
  long in_RDI;
  long regval;
  long runlen;
  uint8_t *end;
  uint8_t *p;
  unsigned_long b1;
  unsigned_long b0;
  unsigned_long _fb8;
  unsigned_long _fb;
  unsigned_long _byte;
  uint8_t *_p;
  uint8_t val;
  int i;
  hllhdr *hdr;
  long local_70;
  byte *local_60;
  int local_24;
  
  lVar1 = *in_RSI;
  if (*(char *)(lVar1 + 4) == '\0') {
    for (local_24 = 0; local_24 < 0x1000; local_24 = local_24 + 1) {
      lVar4 = (long)((local_24 * 6) / 8);
      bVar2 = (char)local_24 * '\x06' & 7;
      bVar2 = (*(byte *)(lVar1 + 0x11 + lVar4) >> bVar2 |
              *(char *)(lVar1 + 0x12 + lVar4) << (8 - bVar2 & 0x3f)) & 0x3f;
      if (*(byte *)(in_RDI + local_24) < bVar2) {
        *(byte *)(in_RDI + local_24) = bVar2;
      }
    }
  }
  else {
    lVar1 = *in_RSI;
    sVar5 = sdslen((sds)*in_RSI);
    local_60 = (byte *)(lVar1 + 0x11);
    local_24 = 0;
    while (local_60 < (byte *)(lVar1 + sVar5)) {
      if ((*local_60 & 0xc0) == 0) {
        local_24 = local_24 + (*local_60 & 0x3f) + 1;
        local_60 = local_60 + 1;
      }
      else if ((*local_60 & 0xc0) == 0x40) {
        local_24 = local_24 + ((*local_60 & 0x3f) << 8 | (uint)local_60[1]) + 1;
        local_60 = local_60 + 2;
      }
      else {
        uVar3 = ((int)(uint)*local_60 >> 2 & 0x1fU) + 1;
        local_70 = (long)(int)((*local_60 & 3) + 1);
        while (local_70 != 0) {
          if (*(byte *)(in_RDI + local_24) < uVar3) {
            *(char *)(in_RDI + local_24) = (char)uVar3;
          }
          local_24 = local_24 + 1;
          local_70 = local_70 + -1;
        }
        local_60 = local_60 + 1;
      }
    }
    if (local_24 != 0x1000) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int hllMerge(uint8_t *max, robj *hll) {
    struct hllhdr *hdr = (struct hllhdr *) hll->ptr;
    int i;

    if (hdr->encoding == HLL_DENSE) {
        uint8_t val;

        for (i = 0; i < HLL_REGISTERS; i++) {
            HLL_DENSE_GET_REGISTER(val,hdr->registers + 1,i);
            if (val > max[i]) max[i] = val;
        }
    } else {
        uint8_t *p = (uint8_t *) hll->ptr, *end = p + sdslen((sds) hll->ptr);
        long runlen, regval;

        p += HLL_HDR_SIZE;
        i = 0;
        while(p < end) {
            if (HLL_SPARSE_IS_ZERO(p)) {
                runlen = HLL_SPARSE_ZERO_LEN(p);
                i += runlen;
                p++;
            } else if (HLL_SPARSE_IS_XZERO(p)) {
                runlen = HLL_SPARSE_XZERO_LEN(p);
                i += runlen;
                p += 2;
            } else {
                runlen = HLL_SPARSE_VAL_LEN(p);
                regval = HLL_SPARSE_VAL_VALUE(p);
                while(runlen--) {
                    if (regval > max[i]) max[i] = regval;
                    i++;
                }
                p++;
            }
        }
        if (i != HLL_REGISTERS) return HLL_C_ERR;
    }
    return HLL_C_OK;
}